

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O2

void av1_update_intra_mb_txb_context
               (AV1_COMP *cpi,ThreadData_conflict *td,RUN_TYPE dry_run,BLOCK_SIZE bsize,
               uint8_t allow_update_cdf)

{
  MACROBLOCKD *xd;
  uint num_planes;
  int *piVar1;
  ulong uVar2;
  code *visit;
  tokenize_b_args arg;
  AV1_COMP *local_48;
  ThreadData_conflict *local_40;
  undefined4 local_38;
  uint8_t local_34;
  RUN_TYPE local_33;
  
  num_planes = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
  xd = &(td->mb).e_mbd;
  local_38 = 0;
  local_48 = cpi;
  local_40 = td;
  local_34 = allow_update_cdf;
  local_33 = dry_run;
  if ((*(td->mb).e_mbd.mi)->skip_txfm != '\0') {
    av1_reset_entropy_context(xd,bsize,num_planes);
    return;
  }
  if (allow_update_cdf == '\0') {
    visit = av1_record_txb_context;
  }
  else {
    visit = av1_update_and_record_txb_context;
  }
  piVar1 = &(td->mb).e_mbd.plane[0].subsampling_y;
  uVar2 = 0;
  while ((num_planes != uVar2 && ((uVar2 == 0 || ((td->mb).e_mbd.is_chroma_ref == true))))) {
    av1_foreach_transformed_block_in_plane
              (xd,av1_ss_size_lookup[bsize][piVar1[-1]][*piVar1],(int)uVar2,visit,&local_48);
    uVar2 = uVar2 + 1;
    piVar1 = piVar1 + 0x28c;
  }
  return;
}

Assistant:

void av1_update_intra_mb_txb_context(const AV1_COMP *cpi, ThreadData *td,
                                     RUN_TYPE dry_run, BLOCK_SIZE bsize,
                                     uint8_t allow_update_cdf) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct tokenize_b_args arg = { cpi, td, 0, allow_update_cdf, dry_run };
  if (mbmi->skip_txfm) {
    av1_reset_entropy_context(xd, bsize, num_planes);
    return;
  }
  const foreach_transformed_block_visitor visit =
      allow_update_cdf ? av1_update_and_record_txb_context
                       : av1_record_txb_context;

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int ss_x = pd->subsampling_x;
    const int ss_y = pd->subsampling_y;
    const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
    av1_foreach_transformed_block_in_plane(xd, plane_bsize, plane, visit, &arg);
  }
}